

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mutex_posix.c
# Opt level: O2

int mutex_unlock_shared(mutex_handle *mutex)

{
  pthread_cond_t *__mutex;
  int *piVar1;
  pthread_cond_t *__cond;
  int iVar2;
  
  __cond = (pthread_cond_t *)mutex->priv;
  __mutex = __cond + 1;
  iVar2 = pthread_mutex_lock((pthread_mutex_t *)__mutex);
  if (iVar2 == 0) {
    piVar1 = (int *)((long)__cond + 0x58);
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      iVar2 = pthread_cond_broadcast(__cond);
      if (iVar2 != 0) {
        pthread_mutex_unlock((pthread_mutex_t *)__mutex);
        goto LAB_0010796f;
      }
    }
    iVar2 = pthread_mutex_unlock((pthread_mutex_t *)__mutex);
  }
LAB_0010796f:
  return -iVar2;
}

Assistant:

int mutex_unlock_shared(struct mutex_handle *mutex)
{
	struct mutex_priv *priv = mutex->priv;
	int ret;

	ret = pthread_mutex_lock(&priv->lock);
	if (ret != 0)
		return -ret;

	if (--(priv->readers) <= 0) {
		ret = pthread_cond_broadcast(&priv->cond);
		if (ret != 0) {
			ret = -ret;
			goto mutex_unlock_shared_exit;
		}
	}

	return -pthread_mutex_unlock(&priv->lock);

mutex_unlock_shared_exit:
	pthread_mutex_unlock(&priv->lock);

	return ret;
}